

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O1

void data_sheet_expat_callback_skip_tag_end(void *callbackdata,XML_Char *name)

{
  long *plVar1;
  int iVar2;
  
  if ((name != (XML_Char *)0x0) &&
     (iVar2 = XML_Char_icmp_ins(name,*(XML_Char **)((long)callbackdata + 0x48)), iVar2 != 0)) {
    return;
  }
  plVar1 = (long *)((long)callbackdata + 0x50);
  *plVar1 = *plVar1 + -1;
  if (*plVar1 == 0) {
    XML_SetElementHandler
              (*callbackdata,*(undefined8 *)((long)callbackdata + 0x58),
               *(undefined8 *)((long)callbackdata + 0x60));
    XML_SetCharacterDataHandler(*callbackdata,*(undefined8 *)((long)callbackdata + 0x68));
    free(*(void **)((long)callbackdata + 0x48));
    *(undefined8 *)((long)callbackdata + 0x48) = 0;
  }
  return;
}

Assistant:

void data_sheet_expat_callback_skip_tag_end (void* callbackdata, const XML_Char* name)
{
  struct data_sheet_callback_data* data = (struct data_sheet_callback_data*)callbackdata;
  if (!name || XML_Char_icmp_ins(name, data->skiptag) == 0) {
    if (--data->skiptagcount == 0) {
      //restore handlers when done skipping
      XML_SetElementHandler(data->xmlparser, data->skip_start, data->skip_end);
      XML_SetCharacterDataHandler(data->xmlparser, data->skip_data);
      free(data->skiptag);
      data->skiptag = NULL;
    }
  }
}